

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

void __thiscall Fl_Tree::vposition(Fl_Tree *this,int pos)

{
  int iVar1;
  double dVar2;
  int local_14;
  int pos_local;
  Fl_Tree *this_local;
  
  local_14 = pos;
  if (pos < 0) {
    local_14 = 0;
  }
  dVar2 = Fl_Valuator::maximum((Fl_Valuator *)this->_vscroll);
  if (dVar2 < (double)local_14) {
    dVar2 = Fl_Valuator::maximum((Fl_Valuator *)this->_vscroll);
    local_14 = (int)dVar2;
  }
  iVar1 = Fl_Scrollbar::value(this->_vscroll);
  if (local_14 != iVar1) {
    Fl_Scrollbar::value(this->_vscroll,local_14);
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  return;
}

Assistant:

void Fl_Tree::vposition(int pos) {
  if (pos < 0) pos = 0;
  if (pos > _vscroll->maximum()) pos = (int)_vscroll->maximum();
  if (pos == _vscroll->value()) return;
  _vscroll->value(pos);
  redraw();
}